

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall mario::EventLoop::EventLoop(EventLoop *this)

{
  int *piVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  Writer *pWVar5;
  Channel *pCVar6;
  EPoller *this_00;
  TimerQueue *this_01;
  long *in_FS_OFFSET;
  EventLoop *local_b0;
  undefined1 local_a8 [24];
  code *local_90;
  LineNumber local_88;
  char *local_80;
  VerboseLevel local_78;
  Logger *local_70;
  bool local_68;
  Logger *local_60;
  char *local_58;
  DispatchAction local_50;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  this->_callingPendingFunctors = false;
  iVar4 = eventfd(0,0x80800);
  if (iVar4 < 0) {
    local_a8._0_8_ = &PTR__Writer_00134bd0;
    local_a8._8_8_ = (LogMessage *)0x0;
    local_a8._16_4_ = Fatal;
    local_90 = (code *)0x1243f8;
    local_88 = 0x18;
    local_80 = "int createEventfd()";
    local_78 = 0;
    local_70 = (Logger *)0x0;
    local_68 = false;
    local_60 = (Logger *)0x0;
    local_58 = "";
    local_50 = NormalLog;
    local_48 = (pointer)0x0;
    pbStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    pWVar5 = el::base::Writer::construct((Writer *)local_a8,1,"default");
    if (pWVar5->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,"Failed in eventfd");
    }
    el::base::Writer::~Writer((Writer *)local_a8);
  }
  this->_wakeupFd = iVar4;
  pCVar6 = (Channel *)operator_new(0xa0);
  Channel::Channel(pCVar6,this,iVar4);
  (this->_wakeupChannel)._M_t.
  super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
  super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
  super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl = pCVar6;
  pthread_mutex_init((pthread_mutex_t *)&this->_mutex,(pthread_mutexattr_t *)0x0);
  (this->_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  iVar4 = (int)in_FS_OFFSET[-1];
  if (iVar4 == 0) {
    CurrentThread::cacheTid();
    iVar4 = (int)in_FS_OFFSET[-1];
  }
  this->_threadId = iVar4;
  Timestamp::Timestamp(&this->_pollReturnTime);
  this_00 = (EPoller *)operator_new(0x58);
  EPoller::EPoller(this_00,this);
  (this->_poller)._M_t.super___uniq_ptr_impl<mario::EPoller,_std::default_delete<mario::EPoller>_>.
  _M_t.super__Tuple_impl<0UL,_mario::EPoller_*,_std::default_delete<mario::EPoller>_>.
  super__Head_base<0UL,_mario::EPoller_*,_false>._M_head_impl = this_00;
  this_01 = (TimerQueue *)operator_new(0x148);
  TimerQueue::TimerQueue(this_01,this);
  (this->_timerQueue)._M_t.
  super___uniq_ptr_impl<mario::TimerQueue,_std::default_delete<mario::TimerQueue>_>._M_t.
  super__Tuple_impl<0UL,_mario::TimerQueue_*,_std::default_delete<mario::TimerQueue>_>.
  super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl = this_01;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._0_8_ = &PTR__Writer_00134bd0;
  local_a8._8_8_ = (LogMessage *)0x0;
  local_a8._16_4_ = Info;
  local_90 = (code *)0x1243f8;
  local_88 = 0x27;
  local_80 = "mario::EventLoop::EventLoop()";
  local_78 = 0;
  local_70 = (Logger *)0x0;
  local_68 = false;
  local_60 = (Logger *)0x0;
  local_58 = "";
  local_50 = NormalLog;
  local_48 = (pointer)0x0;
  pbStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pWVar5 = el::base::Writer::construct((Writer *)local_a8,1,"default");
  bVar3 = pWVar5->m_proceed;
  if ((bool)bVar3 == true) {
    el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,"EventLoop created");
    bVar3 = pWVar5->m_proceed;
  }
  local_b0 = this;
  if ((bVar3 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,&local_b0);
    bVar3 = pWVar5->m_proceed;
  }
  if ((bVar3 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder," in thread ");
    bVar3 = pWVar5->m_proceed;
  }
  if ((bVar3 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,this->_threadId);
  }
  el::base::Writer::~Writer((Writer *)local_a8);
  if (in_FS_OFFSET[-2] == 0) {
    in_FS_OFFSET[-2] = (long)this;
  }
  else {
    lVar2 = *in_FS_OFFSET;
    local_a8._0_8_ = &PTR__Writer_00134bd0;
    local_a8._8_8_ = (LogMessage *)0x0;
    local_a8._16_4_ = Fatal;
    local_90 = (code *)0x1243f8;
    local_88 = 0x29;
    local_80 = "mario::EventLoop::EventLoop()";
    local_78 = 0;
    local_70 = (Logger *)0x0;
    local_68 = false;
    local_60 = (Logger *)0x0;
    local_58 = "";
    local_50 = NormalLog;
    local_48 = (pointer)0x0;
    pbStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    pWVar5 = el::base::Writer::construct((Writer *)local_a8,1,"default");
    bVar3 = pWVar5->m_proceed;
    if ((bool)bVar3 == true) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,"Another EventLoop ");
      bVar3 = pWVar5->m_proceed;
    }
    if ((bVar3 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,(EventLoop **)(lVar2 + -0x10));
      bVar3 = pWVar5->m_proceed;
    }
    if ((bVar3 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder," exists in this thread ");
      bVar3 = pWVar5->m_proceed;
    }
    if ((bVar3 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,this->_threadId);
    }
    el::base::Writer::~Writer((Writer *)local_a8);
  }
  pCVar6 = (this->_wakeupChannel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_a8._8_8_ = (LogMessage *)0x0;
  local_a8._0_8_ = operator_new(0x18);
  *(code **)local_a8._0_8_ = handleRead;
  *(_func_int **)(local_a8._0_8_ + 8) = (_func_int *)0x0;
  *(EventLoop **)(local_a8._0_8_ + 0x10) = this;
  local_90 = std::
             _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::EventLoop::*(mario::EventLoop_*))()>_>
             ::_M_invoke;
  local_a8._16_8_ =
       std::
       _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::EventLoop::*(mario::EventLoop_*))()>_>
       ::_M_manager;
  std::function<void_(mario::Timestamp)>::operator=
            (&pCVar6->_readCallback,(function<void_(mario::Timestamp)> *)local_a8);
  if ((_Manager_type)local_a8._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_a8._16_8_)((_Any_data *)local_a8,(_Any_data *)local_a8,__destroy_functor);
  }
  pCVar6 = (this->_wakeupChannel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  piVar1 = &pCVar6->_events;
  *piVar1 = *piVar1 | 3;
  Channel::update(pCVar6);
  return;
}

Assistant:

EventLoop::EventLoop() 
	: _looping(false)
    , _poller(new EPoller(this))
    , _timerQueue(new TimerQueue(this))
	, _threadId(CurrentThread::tid()) 
    , _callingPendingFunctors(false)
    , _wakeupFd(createEventfd())
    , _wakeupChannel(new Channel(this, _wakeupFd))
{

	LOG(INFO) << "EventLoop created" << this << " in thread " << _threadId;
	if (t_loopInThisThread) {
		LOG(FATAL) << "Another EventLoop " << t_loopInThisThread
				  << " exists in this thread " << _threadId;
	} else {
		t_loopInThisThread = this;
	}

    _wakeupChannel -> setReadCallback(
            std::bind(&EventLoop::handleRead, this)
        );
    _wakeupChannel -> enableReading();
}